

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

SysObject ** __thiscall
r_code::vector<r_code::SysObject_*>::operator[](vector<r_code::SysObject_*> *this,size_t i)

{
  size_t sVar1;
  reference ppSVar2;
  size_t i_local;
  vector<r_code::SysObject_*> *this_local;
  
  sVar1 = size(this);
  if (sVar1 <= i) {
    std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::resize
              (&this->m_vector,i + 1);
  }
  ppSVar2 = std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::at
                      (&this->m_vector,i);
  return ppSVar2;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }